

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O1

size_t luaC_separateudata(lua_State *L,int all)

{
  global_State *pgVar1;
  Table *events;
  TValue *pTVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  size_t sVar5;
  
  pgVar1 = L->l_G;
  pGVar3 = (GCObject *)pgVar1->mainthread;
  pGVar4 = (pGVar3->gch).next;
  if (pGVar4 == (GCObject *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      if ((((pGVar4->gch).marked & 8) == 0) && (((pGVar4->gch).marked & 3) != 0 || all != 0)) {
        events = (pGVar4->h).metatable;
        if ((events == (Table *)0x0) ||
           (((events->flags & 4) != 0 ||
            (pTVar2 = luaT_gettm(events,TM_GC,L->l_G->tmname[2]), pTVar2 == (TValue *)0x0)))) {
          (pGVar4->gch).marked = (pGVar4->gch).marked | 8;
        }
        else {
          (pGVar4->gch).marked = (pGVar4->gch).marked | 8;
          sVar5 = (long)&(pGVar4->h).node[1].i_val.value + sVar5;
          (pGVar3->gch).next = (pGVar4->gch).next;
          if (pgVar1->tmudata == (GCObject *)0x0) {
            (pGVar4->gch).next = pGVar4;
          }
          else {
            (pGVar4->gch).next = (pgVar1->tmudata->gch).next;
            (pgVar1->tmudata->gch).next = pGVar4;
          }
          pgVar1->tmudata = pGVar4;
          pGVar4 = pGVar3;
        }
      }
      pGVar3 = pGVar4;
      pGVar4 = (pGVar3->gch).next;
    } while (pGVar4 != (GCObject *)0x0);
  }
  return sVar5;
}

Assistant:

size_t luaC_separateudata (lua_State *L, int all) {
  global_State *g = G(L);
  size_t deadmem = 0;
  GCObject **p = &g->mainthread->next;
  GCObject *curr;
  while ((curr = *p) != NULL) {
    if (!(iswhite(curr) || all) || isfinalized(gco2u(curr)))
      p = &curr->gch.next;  /* don't bother with them */
    else if (fasttm(L, gco2u(curr)->metatable, TM_GC) == NULL) {
      markfinalized(gco2u(curr));  /* don't need finalization */
      p = &curr->gch.next;
    }
    else {  /* must call its gc method */
      deadmem += sizeudata(gco2u(curr));
      markfinalized(gco2u(curr));
      *p = curr->gch.next;
      /* link `curr' at the end of `tmudata' list */
      if (g->tmudata == NULL)  /* list is empty? */
        g->tmudata = curr->gch.next = curr;  /* creates a circular list */
      else {
        curr->gch.next = g->tmudata->gch.next;
        g->tmudata->gch.next = curr;
        g->tmudata = curr;
      }
    }
  }
  return deadmem;
}